

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
FlatSigningProvider::GetPubKey(FlatSigningProvider *this,CKeyID *keyid,CPubKey *pubkey)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    bVar1 = LookupHelper<std::map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>,CKeyID,CPubKey>
                      (&this->pubkeys,keyid,pubkey);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetPubKey(const CKeyID& keyid, CPubKey& pubkey) const { return LookupHelper(pubkeys, keyid, pubkey); }